

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O3

Regexp * __thiscall re2::Regexp::Simplify(Regexp *this)

{
  Regexp *re;
  Regexp *pRVar1;
  SimplifyWalker sw;
  CoalesceWalker cw;
  Walker<re2::Regexp_*> local_40;
  Walker<re2::Regexp_*> local_28;
  
  Walker<re2::Regexp_*>::Walker(&local_28);
  local_28._vptr_Walker = (_func_int **)&PTR__Walker_00617160;
  local_28.max_visits_ = 1000000;
  re = Walker<re2::Regexp_*>::WalkInternal(&local_28,this,(Regexp *)0x0,true);
  if (re == (Regexp *)0x0) {
    pRVar1 = (Regexp *)0x0;
  }
  else {
    Walker<re2::Regexp_*>::Walker(&local_40);
    local_40._vptr_Walker = (_func_int **)&PTR__Walker_006171b8;
    local_40.max_visits_ = 1000000;
    pRVar1 = Walker<re2::Regexp_*>::WalkInternal(&local_40,re,(Regexp *)0x0,true);
    Decref(re);
    Walker<re2::Regexp_*>::~Walker(&local_40);
  }
  Walker<re2::Regexp_*>::~Walker(&local_28);
  return pRVar1;
}

Assistant:

Regexp* Regexp::Simplify() {
  CoalesceWalker cw;
  Regexp* cre = cw.Walk(this, NULL);
  if (cre == NULL)
    return cre;
  SimplifyWalker sw;
  Regexp* sre = sw.Walk(cre, NULL);
  cre->Decref();
  return sre;
}